

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdquerymgr.cc
# Opt level: O2

void __thiscall
bdQueryManager::QueryStatus
          (bdQueryManager *this,
          map<bdNodeId,_bdQueryStatus,_std::less<bdNodeId>,_std::allocator<std::pair<const_bdNodeId,_bdQueryStatus>_>_>
          *statusMap)

{
  list<bdId,_std::allocator<bdId>_> *this_00;
  bdQuery *this_01;
  mapped_type *this_02;
  _List_node_base *p_Var1;
  bdQueryStatus status;
  bdQueryStatus local_48;
  
  this_00 = &local_48.mResults;
  p_Var1 = (_List_node_base *)&this->mLocalQueries;
  while (p_Var1 = (((_List_base<bdQuery_*,_std::allocator<bdQuery_*>_> *)&p_Var1->_M_next)->_M_impl)
                  ._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)&this->mLocalQueries) {
    local_48.mResults.super__List_base<bdId,_std::allocator<bdId>_>._M_impl._M_node._M_size = 0;
    this_01 = (bdQuery *)p_Var1[1]._M_next;
    local_48.mStatus = this_01->mState;
    local_48.mQFlags = this_01->mQueryFlags;
    local_48.mResults.super__List_base<bdId,_std::allocator<bdId>_>._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)this_00;
    local_48.mResults.super__List_base<bdId,_std::allocator<bdId>_>._M_impl._M_node.
    super__List_node_base._M_prev = (_List_node_base *)this_00;
    bdQuery::result(this_01,this_00);
    this_02 = std::
              map<bdNodeId,_bdQueryStatus,_std::less<bdNodeId>,_std::allocator<std::pair<const_bdNodeId,_bdQueryStatus>_>_>
              ::operator[](statusMap,(key_type *)p_Var1[1]._M_next);
    bdQueryStatus::operator=(this_02,&local_48);
    std::__cxx11::_List_base<bdId,_std::allocator<bdId>_>::_M_clear
              (&this_00->super__List_base<bdId,_std::allocator<bdId>_>);
  }
  return;
}

Assistant:

void bdQueryManager::QueryStatus(std::map<bdNodeId, bdQueryStatus> &statusMap) {
	std::list<bdQuery *>::iterator it;
	for (it = mLocalQueries.begin(); it != mLocalQueries.end(); it++) {
		bdQueryStatus status;
		status.mStatus = (*it)->mState;
		status.mQFlags = (*it)->mQueryFlags;
		(*it)->result(status.mResults);
		statusMap[(*it)->mId] = status;
	}
}